

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void discharge2reg(FuncState *fs,expdesc *e,int reg)

{
  Instruction *pIVar1;
  int iVar2;
  uint uVar3;
  TValue *i_o;
  Instruction i;
  uint uVar4;
  Value local_28;
  undefined4 local_20;
  
  luaK_dischargevars(fs,e);
  switch(e->k) {
  case VNIL:
    luaK_nil(fs,reg,1);
    break;
  case VTRUE:
  case VFALSE:
    uVar3 = 2;
    if (e->k == VTRUE) {
      uVar3 = 0x800000;
    }
    i = uVar3 | reg << 6 | 2;
    goto LAB_0010e5c6;
  case VK:
    uVar3 = reg << 6;
    uVar4 = (e->u).s.info << 0xe;
    goto LAB_0010e5c2;
  case VKNUM:
    local_28 = *(Value *)&e->u;
    local_20 = 3;
    iVar2 = addk(fs,(TValue *)&local_28,(TValue *)&local_28);
    uVar4 = reg << 6;
    uVar3 = iVar2 << 0xe;
LAB_0010e5c2:
    i = (uVar4 | uVar3) + 1;
LAB_0010e5c6:
    luaK_code(fs,i,fs->ls->lastline);
    break;
  default:
    goto switchD_0010e52c_caseD_6;
  case VRELOCABLE:
    pIVar1 = fs->f->code;
    iVar2 = (e->u).s.info;
    pIVar1[iVar2] = (reg & 0xffU) << 6 | pIVar1[iVar2] & 0xffffc03f;
    break;
  case VNONRELOC:
    iVar2 = (e->u).s.info;
    if (iVar2 != reg) {
      i = iVar2 << 0x17 | reg << 6;
      goto LAB_0010e5c6;
    }
  }
  (e->u).s.info = reg;
  e->k = VNONRELOC;
switchD_0010e52c_caseD_6:
  return;
}

Assistant:

static void discharge2reg(FuncState*fs,expdesc*e,int reg){
luaK_dischargevars(fs,e);
switch(e->k){
case VNIL:{
luaK_nil(fs,reg,1);
break;
}
case VFALSE:case VTRUE:{
luaK_codeABC(fs,OP_LOADBOOL,reg,e->k==VTRUE,0);
break;
}
case VK:{
luaK_codeABx(fs,OP_LOADK,reg,e->u.s.info);
break;
}
case VKNUM:{
luaK_codeABx(fs,OP_LOADK,reg,luaK_numberK(fs,e->u.nval));
break;
}
case VRELOCABLE:{
Instruction*pc=&getcode(fs,e);
SETARG_A(*pc,reg);
break;
}
case VNONRELOC:{
if(reg!=e->u.s.info)
luaK_codeABC(fs,OP_MOVE,reg,e->u.s.info,0);
break;
}
default:{
return;
}
}
e->u.s.info=reg;
e->k=VNONRELOC;
}